

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcPartialsPartialsAutoScaling
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          float *partials2,float *matrices2,int *activateScaling)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int expTmp;
  int local_64;
  float *local_60;
  float *local_58;
  BeagleCPUImpl<float,_1,_0> *local_50;
  float *local_48;
  float *local_40;
  float *local_38;
  
  if (0 < this->kCategoryCount) {
    iVar4 = 0;
    local_60 = partials1;
    local_58 = partials2;
    local_50 = this;
    local_48 = destP;
    local_40 = matrices1;
    local_38 = matrices2;
    do {
      if (0 < this->kPatternCount) {
        uVar5 = this->kPartialsPaddedStateCount * iVar4 * this->kPatternCount;
        iVar7 = 0;
        uVar11 = (ulong)uVar5;
        do {
          pfVar2 = local_58;
          pfVar1 = local_60;
          uVar3 = this->kStateCount;
          if (0 < (int)uVar3) {
            iVar9 = this->kMatrixSize * iVar4;
            uVar11 = (ulong)(int)uVar11;
            iVar10 = 0;
            do {
              if ((int)uVar3 < 1) {
                fVar12 = 0.0;
              }
              else {
                auVar13 = ZEXT816(0);
                uVar8 = 0;
                auVar14 = ZEXT816(0) << 0x40;
                do {
                  auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)local_40[(long)iVar9 + uVar8]),
                                            ZEXT416((uint)pfVar1[(long)(int)uVar5 + uVar8]));
                  auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)local_38[(long)iVar9 + uVar8]),
                                            ZEXT416((uint)pfVar2[(long)(int)uVar5 + uVar8]));
                  uVar8 = uVar8 + 1;
                } while (uVar3 != uVar8);
                iVar9 = iVar9 + uVar3;
                fVar12 = auVar14._0_4_ * auVar13._0_4_;
              }
              destP[uVar11] = fVar12;
              if (*activateScaling == 0) {
                frexp((double)fVar12,&local_64);
                iVar6 = -local_64;
                if (0 < local_64) {
                  iVar6 = local_64;
                }
                destP = local_48;
                this = local_50;
                if (local_50->scalingExponentThreshold < iVar6) {
                  *activateScaling = 1;
                }
              }
              iVar9 = iVar9 + 1;
              uVar11 = uVar11 + 1;
              iVar10 = iVar10 + 1;
              uVar3 = this->kStateCount;
            } while (iVar10 < (int)uVar3);
          }
          uVar5 = uVar5 + this->kPartialsPaddedStateCount;
          iVar7 = iVar7 + 1;
        } while (iVar7 < this->kPatternCount);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < this->kCategoryCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartialsAutoScaling(REALTYPE* destP,
                                                               const REALTYPE* partials1,
                                                               const REALTYPE* matrices1,
                                                               const REALTYPE* partials2,
                                                               const REALTYPE* matrices2,
                                                               int* activateScaling) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*kPartialsPaddedStateCount*kPatternCount;
        int v = l*kPartialsPaddedStateCount*kPatternCount;
        for (int k = 0; k < kPatternCount; k++) {
            int w = l * kMatrixSize;
            for (int i = 0; i < kStateCount; i++) {
                REALTYPE sum1 = 0.0, sum2 = 0.0;
                for (int j = 0; j < kStateCount; j++) {
                    sum1 += matrices1[w] * partials1[v + j];
                    sum2 += matrices2[w] * partials2[v + j];
                    w++;
                }

                // increment for the extra column at the end
                w += T_PAD;

                destP[u] = sum1 * sum2;

                if (*activateScaling == 0) {
                    int expTmp;
                    frexp(destP[u], &expTmp);
                    if (abs(expTmp) > scalingExponentThreshold)
                        *activateScaling = 1;
                }

                u++;
            }
            u += P_PAD;
            v += kPartialsPaddedStateCount;
        }
    }
}